

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_SetPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_SetPeginWitnessStack_Test *this)

{
  ByteData *pBVar1;
  undefined8 lhs;
  bool bVar2;
  char *pcVar3;
  undefined1 local_280 [16];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [16];
  undefined1 local_260 [32];
  AssertionResult gtest_ar;
  ByteData exp_data;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_218;
  ScriptWitness exp_witness_stack;
  ScriptWitness exp_pegin_witness;
  ScriptWitness local_1c0;
  ScriptWitness local_1a0;
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  pBVar1 = &txin.super_AbstractTxIn.txid_.data_;
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&txin,"1234567890","");
  cfd::core::ByteData::ByteData(&exp_data,(string *)&txin);
  if ((ByteData *)txin.super_AbstractTxIn._vptr_AbstractTxIn != pBVar1) {
    operator_delete(txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTxIn::SetPeginWitnessStack(&local_1a0,&txin,1,&exp_data);
      local_1a0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_1a0.witness_stack_);
    }
  }
  else {
    testing::Message::Message((Message *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,200,
               "Expected: (txin.SetPeginWitnessStack(target_index, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_260,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_260);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  local_280._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_280 + 8),
             &txin.pegin_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness(&local_218,(ScriptWitness *)local_280);
  local_280._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_280 + 8));
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)local_280,
             local_218.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  lhs = local_280._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_260,&exp_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",(char *)lhs,(char *)local_260._0_8_);
  if ((AssertHelperData *)local_260._0_8_ != (AssertHelperData *)(local_260 + 0x10)) {
    operator_delete((void *)local_260._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
      local_270) {
    operator_delete((void *)local_280._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_260,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_260);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)local_260,&txin);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_280,(ByteData256 *)local_260);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txin.GetWitnessHash().GetHex().c_str()",
             "\"78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd\"",
             (char *)local_280._0_8_,
             "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
      local_270) {
    operator_delete((void *)local_280._0_8_);
  }
  if ((AssertHelperData *)local_260._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_260._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_260,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_260);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTxIn::SetPeginWitnessStack(&local_1c0,&txin,9,&exp_data);
    local_1c0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              (&local_1c0.witness_stack_);
  }
  testing::Message::Message((Message *)local_280);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
             ,0xd2,
             "Expected: (txin.SetPeginWitnessStack(9, exp_data)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_260,(Message *)local_280);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_260);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_218);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  if (exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  exp_witness_stack._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_witness_stack.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 1;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.SetPeginWitnessStack(target_index, exp_data)));
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());

  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");

  // fail case
  EXPECT_THROW((txin.SetPeginWitnessStack(9, exp_data)), CfdException);
}